

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O0

unique_ptr<void_*[],_std::default_delete<void_*[]>_> __thiscall
tcmalloc::ProduceStackTracesDump
          (tcmalloc *this,_func_StackTrace_ptr_void_ptr_ptr *next_fn,void *head)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  void **__p;
  undefined8 *puVar4;
  type ppvVar5;
  int local_68;
  int d;
  StackTrace *trace_1;
  void *entry_1;
  undefined1 local_3d;
  int idx;
  long lStack_38;
  int out_len;
  StackTrace *trace;
  void *entry;
  int bucket_total;
  int depth_total;
  void *head_local;
  _func_StackTrace_ptr_void_ptr_ptr *next_fn_local;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> *out;
  
  entry._4_4_ = 0;
  entry._0_4_ = 0;
  trace = (StackTrace *)head;
  _bucket_total = (StackTrace *)head;
  head_local = next_fn;
  next_fn_local = (_func_StackTrace_ptr_void_ptr_ptr *)this;
  while (trace != (StackTrace *)0x0) {
    lStack_38 = (*(code *)head_local)(&trace);
    entry._4_4_ = entry._4_4_ + (int)*(undefined8 *)(lStack_38 + 8);
    entry._0_4_ = (int)entry + 1;
  }
  idx = (int)entry * 3 + entry._4_4_ + 1;
  local_3d = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)idx;
  sVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    sVar3 = 0xffffffffffffffff;
  }
  __p = (void **)operator_new__(sVar3);
  std::unique_ptr<void*[],std::default_delete<void*[]>>::
  unique_ptr<void**,std::default_delete<void*[]>,void,bool>
            ((unique_ptr<void*[],std::default_delete<void*[]>> *)this,__p);
  entry_1._4_4_ = 0;
  trace_1 = _bucket_total;
  while (trace_1 != (StackTrace *)0x0) {
    puVar4 = (undefined8 *)(*(code *)head_local)(&trace_1);
    sVar3 = (size_t)entry_1._4_4_;
    entry_1._4_4_ = entry_1._4_4_ + 1;
    ppvVar5 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)this,sVar3);
    *ppvVar5 = (void *)0x1;
    pvVar1 = (void *)*puVar4;
    sVar3 = (size_t)entry_1._4_4_;
    entry_1._4_4_ = entry_1._4_4_ + 1;
    ppvVar5 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)this,sVar3);
    *ppvVar5 = pvVar1;
    pvVar1 = (void *)puVar4[1];
    sVar3 = (size_t)entry_1._4_4_;
    entry_1._4_4_ = entry_1._4_4_ + 1;
    ppvVar5 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                        ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)this,sVar3);
    *ppvVar5 = pvVar1;
    for (local_68 = 0; (ulong)(long)local_68 < (ulong)puVar4[1]; local_68 = local_68 + 1) {
      pvVar1 = (void *)puVar4[(long)local_68 + 2];
      sVar3 = (size_t)entry_1._4_4_;
      entry_1._4_4_ = entry_1._4_4_ + 1;
      ppvVar5 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                          ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)this,sVar3);
      *ppvVar5 = pvVar1;
    }
  }
  sVar3 = (size_t)entry_1._4_4_;
  entry_1._4_4_ = entry_1._4_4_ + 1;
  ppvVar5 = std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::operator[]
                      ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)this,sVar3);
  *ppvVar5 = (void *)0x0;
  return (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
         (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<void*[]> ProduceStackTracesDump(const StackTrace* (*next_fn)(const void** current_head),
                                                const void* head) {
  int depth_total = 0;
  int bucket_total = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    depth_total += trace->depth;
    bucket_total++;
  }

  int out_len = bucket_total * 3 + depth_total + 1;
  std::unique_ptr<void*[]> out{new void*[out_len]};

  int idx = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    out[idx++] = reinterpret_cast<void*>(uintptr_t{1});   // count
    out[idx++] = reinterpret_cast<void*>(trace->size);  // cumulative size
    out[idx++] = reinterpret_cast<void*>(trace->depth);
    for (int d = 0; d < trace->depth; ++d) {
      out[idx++] = trace->stack[d];
    }
  }
  out[idx++] = nullptr;
  ASSERT(idx == out_len);

  return out;
}